

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

cio_error read_some_chunks(cio_io_stream *ios,cio_read_buffer *buffer,
                          cio_io_stream_read_handler_t handler,void *context)

{
  _func_cio_error_cio_io_stream_ptr_cio_read_buffer_ptr_cio_io_stream_read_handler_t_void_ptr *__s;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  __s = ios[1].read_some;
  sVar2 = strlen((char *)__s);
  sVar1 = chunk_bytes_written;
  if (read_some_fake.call_count == 1) {
    uVar3 = (long)buffer->end - (long)buffer->add_ptr;
    if (sVar2 >> 1 <= uVar3) {
      uVar3 = sVar2 >> 1;
    }
    memcpy(buffer->add_ptr,__s,uVar3);
    buffer->add_ptr = buffer->add_ptr + uVar3;
    chunk_bytes_written = uVar3 + chunk_bytes_written;
  }
  else {
    uVar3 = (long)buffer->end - (long)buffer->add_ptr;
    if (sVar2 - chunk_bytes_written <= uVar3) {
      uVar3 = sVar2 - chunk_bytes_written;
    }
    memcpy(buffer->add_ptr,__s + chunk_bytes_written,uVar3);
    buffer->add_ptr = buffer->add_ptr + uVar3;
    chunk_bytes_written = uVar3 + sVar1;
  }
  (*handler)(ios,context,CIO_SUCCESS,buffer);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error read_some_chunks(struct cio_io_stream *ios, struct cio_read_buffer *buffer, cio_io_stream_read_handler_t handler, void *context)
{
	struct memory_stream *memory_stream = cio_container_of(ios, struct memory_stream, ios);
	size_t string_len = strlen(memory_stream->mem);
	if (read_some_fake.call_count == 1) {
		string_len = string_len / 2;
		size_t len = CIO_MIN(cio_read_buffer_space_available(buffer), string_len);
		memcpy(buffer->add_ptr, memory_stream->mem, len);
		buffer->add_ptr += len;
		chunk_bytes_written += len;
		handler(ios, context, CIO_SUCCESS, buffer);
	} else {
		string_len = string_len - chunk_bytes_written;
		size_t len = CIO_MIN(cio_read_buffer_space_available(buffer), string_len);
		memcpy(buffer->add_ptr, (uint8_t *)memory_stream->mem + chunk_bytes_written, len);
		buffer->add_ptr += len;
		chunk_bytes_written += len;
		handler(ios, context, CIO_SUCCESS, buffer);
	}

	return CIO_SUCCESS;
}